

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDtdPtr xmlIOParseDTD(xmlSAXHandlerPtr sax,xmlParserInputBufferPtr input,xmlCharEncoding enc)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input_00;
  xmlDtdPtr pxVar1;
  
  if (input != (xmlParserInputBufferPtr)0x0) {
    ctxt = xmlNewSAXParserCtxt(sax,(void *)0x0);
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      xmlFreeParserInputBuffer(input);
    }
    else {
      xmlCtxtSetOptions(ctxt,4);
      input_00 = xmlNewIOInputStream(ctxt,input,XML_CHAR_ENCODING_NONE);
      if (input_00 != (xmlParserInputPtr)0x0) {
        if (enc != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding(ctxt,enc);
        }
        pxVar1 = xmlCtxtParseDtd(ctxt,input_00,(xmlChar *)0x0,(xmlChar *)0x0);
        xmlFreeParserCtxt(ctxt);
        return pxVar1;
      }
      xmlFreeParserInputBuffer(input);
      xmlFreeParserCtxt(ctxt);
    }
  }
  return (xmlDtdPtr)0x0;
}

Assistant:

xmlDtdPtr
xmlIOParseDTD(xmlSAXHandlerPtr sax, xmlParserInputBufferPtr input,
	      xmlCharEncoding enc) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr pinput = NULL;

    if (input == NULL)
	return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(input);
	return(NULL);
    }
    xmlCtxtSetOptions(ctxt, XML_PARSE_DTDLOAD);

    /*
     * generate a parser input from the I/O handler
     */

    pinput = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (pinput == NULL) {
        xmlFreeParserInputBuffer(input);
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    ret = xmlCtxtParseDtd(ctxt, pinput, NULL, NULL);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}